

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::mish(tensor *dest,tensor *src)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  size_t sVar5;
  tensor *in_RSI;
  long *in_RDI;
  float fVar6;
  double dVar7;
  float delta;
  float e;
  size_t i;
  float *s;
  float *d;
  ulong local_28;
  long lVar4;
  
  lVar3 = (**(code **)(*in_RDI + 0x20))();
  iVar2 = (*in_RSI->_vptr_tensor[2])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_28 = 0;
  while( true ) {
    sVar5 = tensor::size(in_RSI);
    if (sVar5 <= local_28) break;
    dVar7 = std::exp((double)(ulong)*(uint *)(lVar4 + local_28 * 4));
    fVar6 = SUB84(dVar7,0);
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar6),
                             ZEXT416((uint)(fVar6 * fVar6)));
    *(float *)(lVar3 + local_28 * 4) =
         *(float *)(lVar4 + local_28 * 4) -
         (*(float *)(lVar4 + local_28 * 4) * 2.0) / (auVar1._0_4_ + 2.0);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void mish (
            tensor& dest,
            const tensor& src
        )
        {
            const auto d = dest.host_write_only();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
            {
                const auto e = std::exp(s[i]);
                const auto delta = 2*e + e*e + 2;
                d[i] = s[i] - 2*s[i]/delta;
            }
        }